

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::~TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                  *this,void **vtt)

{
  TPZVec<int> *in_RSI;
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffd8;
  
  *in_RDI = in_RSI->_vptr_TPZVec;
  TPZVec<int>::~TPZVec(in_RSI);
  TPZVec<int>::~TPZVec(in_RSI);
  TPZFrontSym<std::complex<long_double>_>::~TPZFrontSym
            ((TPZFrontSym<std::complex<long_double>_> *)0x1d016c6);
  TPZFileEqnStorage<std::complex<long_double>_>::~TPZFileEqnStorage
            ((TPZFileEqnStorage<std::complex<long_double>_> *)0x1d016d4);
  TPZAbstractFrontMatrix<std::complex<long_double>_>::~TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<std::complex<long_double>_> *)in_RSI,in_stack_ffffffffffffffd8)
  ;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}